

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QTabBar * __thiscall QMainWindowLayout::getTabBar(QMainWindowLayout *this)

{
  long lVar1;
  bool bVar2;
  value_type signal;
  char *in_RDI;
  long in_FS_OFFSET;
  ConnectionType in_stack_00000010;
  QTabBar *result;
  undefined4 in_stack_ffffffffffffff78;
  TextElideMode in_stack_ffffffffffffff7c;
  QMainWindowTabBar *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QObject *in_stack_ffffffffffffff98;
  offset_in_QMainWindowLayout_to_subr *in_stack_ffffffffffffffc0;
  ContextType *in_stack_ffffffffffffffc8;
  Connection local_20;
  QObject local_18 [8];
  QLayout *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QSet<QTabBar_*>::isEmpty((QSet<QTabBar_*> *)0x5f81d7);
  if ((!bVar2) && ((in_RDI[0x810] & 1U) == 0)) {
    QLayout::activate(in_stack_fffffffffffffff0);
  }
  bVar2 = QList<QTabBar_*>::isEmpty((QList<QTabBar_*> *)0x5f820d);
  if (bVar2) {
    signal = (value_type)operator_new(0x40);
    QLayout::parentWidget((QLayout *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    QMainWindowTabBar::QMainWindowTabBar
              (in_stack_ffffffffffffff80,
               (QMainWindow *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff94 = 1;
    QTabBar::setDrawBase
              ((QTabBar *)CONCAT44(1,in_stack_ffffffffffffff90),SUB81((ulong)signal >> 0x38,0));
    QTabBar::setElideMode(&in_stack_ffffffffffffff80->super_QTabBar,in_stack_ffffffffffffff7c);
    bVar2 = SUB41(in_stack_ffffffffffffff7c >> 0x18,0);
    QTabBar::setDocumentMode(&in_stack_ffffffffffffff80->super_QTabBar,bVar2);
    QTabBar::setMovable(&in_stack_ffffffffffffff80->super_QTabBar,bVar2);
    in_stack_ffffffffffffff98 = local_18;
    QObject::connect(in_stack_ffffffffffffff98,(char *)signal,(QObject *)"2currentChanged(int)",
                     in_RDI,0xb1dd2f);
    QMetaObject::Connection::~Connection((Connection *)in_stack_ffffffffffffff98);
    QObject::connect<void(QTabBar::*)(int,int),void(QMainWindowLayout::*)(int,int)>
              ((Object *)tabMoved,(offset_in_QTabBar_to_subr)signal,in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0,in_stack_00000010);
    QMetaObject::Connection::~Connection(&local_20);
  }
  else {
    signal = QList<QTabBar_*>::takeLast((QList<QTabBar_*> *)in_stack_ffffffffffffff80);
  }
  QSet<QTabBar_*>::insert
            ((QSet<QTabBar_*> *)in_stack_ffffffffffffff98,
             (QTabBar **)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return signal;
  }
  __stack_chk_fail();
}

Assistant:

QTabBar *QMainWindowLayout::getTabBar()
{
    if (!usedTabBars.isEmpty() && !isInRestoreState) {
        /*
            If dock widgets have been removed and added while the main window was
            hidden, then the layout hasn't been activated yet, and tab bars from empty
            docking areas haven't been put in the cache yet.
        */
        activate();
    }

    QTabBar *result = nullptr;
    if (!unusedTabBars.isEmpty()) {
        result = unusedTabBars.takeLast();
    } else {
        result = new QMainWindowTabBar(static_cast<QMainWindow *>(parentWidget()));
        result->setDrawBase(true);
        result->setElideMode(Qt::ElideRight);
        result->setDocumentMode(_documentMode);
        result->setMovable(true);
        connect(result, SIGNAL(currentChanged(int)), this, SLOT(tabChanged()));
        connect(result, &QTabBar::tabMoved, this, &QMainWindowLayout::tabMoved);
    }

    usedTabBars.insert(result);
    return result;
}